

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.cpp
# Opt level: O0

void __thiscall ncnn::Scale::Scale(Scale *this)

{
  undefined8 *in_RDI;
  Layer *in_stack_ffffffffffffffa0;
  
  Layer::Layer(in_stack_ffffffffffffffa0);
  *in_RDI = &PTR__Scale_01fd16b8;
  in_RDI[0x1b] = 0;
  in_RDI[0x1c] = 0;
  in_RDI[0x1d] = 0;
  *(undefined4 *)(in_RDI + 0x1e) = 0;
  in_RDI[0x1f] = 0;
  *(undefined4 *)(in_RDI + 0x20) = 0;
  *(undefined4 *)((long)in_RDI + 0x104) = 0;
  *(undefined4 *)(in_RDI + 0x21) = 0;
  *(undefined4 *)((long)in_RDI + 0x10c) = 0;
  *(undefined4 *)(in_RDI + 0x22) = 0;
  in_RDI[0x23] = 0;
  in_RDI[0x24] = 0;
  in_RDI[0x25] = 0;
  in_RDI[0x26] = 0;
  *(undefined4 *)(in_RDI + 0x27) = 0;
  in_RDI[0x28] = 0;
  *(undefined4 *)(in_RDI + 0x29) = 0;
  *(undefined4 *)((long)in_RDI + 0x14c) = 0;
  *(undefined4 *)(in_RDI + 0x2a) = 0;
  *(undefined4 *)((long)in_RDI + 0x154) = 0;
  *(undefined4 *)(in_RDI + 0x2b) = 0;
  in_RDI[0x2c] = 0;
  *(undefined1 *)(in_RDI + 1) = 1;
  *(undefined1 *)((long)in_RDI + 9) = 1;
  return;
}

Assistant:

Scale::Scale()
{
    one_blob_only = true;
    support_inplace = true;
}